

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O1

LibraryMaterialsLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryMaterialsLoader,COLLADASaxFWL::LibraryMaterialsLoader15>
          (RootParser15 *this,char *id)

{
  FileLoader *pFVar1;
  LibraryMaterialsLoader *this_00;
  IParserImpl15 *this_01;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)this->mFileLoader);
  this_00 = (LibraryMaterialsLoader *)operator_new(0x30);
  LibraryMaterialsLoader::LibraryMaterialsLoader(this_00,(IFilePartLoader *)this->mFileLoader);
  this_01 = (IParserImpl15 *)operator_new(0x20);
  IParserImpl15::IParserImpl15(this_01);
  (this_01->super_IParserImpl)._vptr_IParserImpl = (_func_int **)&PTR__IParserImpl15_009c2f80;
  (this_01->super_ColladaParserAutoGen15)._vptr_ColladaParserAutoGen15 =
       (_func_int **)&PTR__LibraryMaterialsLoader15_009c2fd8;
  this_01[1].super_IParserImpl._vptr_IParserImpl = (_func_int **)this_00;
  (this_00->super_FilePartLoader).super_IFilePartLoader.mParserImpl = (IParserImpl *)this_01;
  pFVar1 = this->mFileLoader;
  (pFVar1->super_DocumentProcessor).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  (*(pFVar1->super_DocumentProcessor).super_IFilePartLoader.super_ExtraDataLoader.
    _vptr_ExtraDataLoader[10])(pFVar1,&this_01->super_ColladaParserAutoGen15);
  DocumentProcessor::addToSidTree(&this->mFileLoader->super_DocumentProcessor,id,(char *)0x0);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}